

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall
pbrt::Image::Image(Image *this,PixelFormat format,Point2i resolution,
                  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  channels,ColorEncodingHandle *encoding,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int *file;
  int *piVar3;
  vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *this_00;
  undefined8 in_RDX;
  PixelFormat in_ESI;
  PixelFormat *in_RDI;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding> *in_R9
  ;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffeb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 uVar4;
  undefined4 in_stack_fffffffffffffedc;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> *in_stack_fffffffffffffee0;
  char (*in_stack_fffffffffffffef0) [20];
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  LogLevel LVar5;
  vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *this_01;
  polymorphic_allocator<unsigned_char> *alloc_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_02;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_70;
  polymorphic_allocator<float> local_68;
  polymorphic_allocator<pbrt::Half> local_60;
  polymorphic_allocator<unsigned_char> local_58 [5];
  PixelFormat local_2c;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  Tuple2<pbrt::Point2,_int> local_8;
  
  *in_RDI = in_ESI;
  *(undefined8 *)(in_RDI + 1) = in_RDX;
  LVar5 = (LogLevel)((ulong)(in_RDI + 4) >> 0x20);
  this_02 = &local_18;
  local_2c = in_ESI;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::begin(this_02);
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::end(this_02);
  pstd::pmr::
  polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::polymorphic_allocator
            ((polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  InlinedVector<std::__cxx11::string,4,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>::
  InlinedVector<std::__cxx11::string_const*>
            ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  ColorEncodingHandle::ColorEncodingHandle
            ((ColorEncodingHandle *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             (ColorEncodingHandle *)in_stack_fffffffffffffea8);
  this_01 = (vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
            (in_RDI + 0x2e);
  alloc_00 = local_58;
  pstd::pmr::polymorphic_allocator<unsigned_char>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<unsigned_char> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
            );
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::vector
            (this_01,alloc_00);
  iVar2 = (int)((ulong)alloc_00 >> 0x20);
  pstd::pmr::polymorphic_allocator<pbrt::Half>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Half> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
            );
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::vector
            ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)(in_RDI + 0x36),
             &local_60);
  pstd::pmr::polymorphic_allocator<float>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<float> *)
             CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8
            );
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x3e),&local_68);
  bVar1 = Is8Bit(local_2c);
  if (bVar1) {
    iVar2 = NChannels((Image *)0x54e781);
    piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_8,0);
    iVar2 = iVar2 * *piVar3;
    file = Tuple2<pbrt::Point2,_int>::operator[](&local_8,1);
    LVar5 = (LogLevel)((ulong)piVar3 >> 0x20);
    pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::resize
              ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
               in_stack_fffffffffffffee0,
               CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>::
    TaggedPointer(&local_70,(nullptr_t)0x0);
    bVar1 = TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
            ::operator!=(in_R9,&local_70);
    if (!bVar1) {
      LogFatal<char_const(&)[20]>
                (LVar5,(char *)file,iVar2,
                 (char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_fffffffffffffef0);
    }
  }
  else {
    bVar1 = Is16Bit(local_2c);
    if (bVar1) {
      iVar2 = NChannels((Image *)0x54e8f7);
      piVar3 = Tuple2<pbrt::Point2,_int>::operator[](&local_8,0);
      iVar2 = iVar2 * *piVar3;
      this_00 = (vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)
                Tuple2<pbrt::Point2,_int>::operator[](&local_8,1);
      pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::resize
                (this_00,CONCAT44(iVar2,in_stack_fffffffffffffed8));
    }
    else {
      bVar1 = Is32Bit(local_2c);
      uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffed8);
      if (!bVar1) {
        LogFatal(LVar5,(char *)this_02,iVar2,(char *)this_01);
      }
      NChannels((Image *)0x54e99a);
      Tuple2<pbrt::Point2,_int>::operator[](&local_8,0);
      Tuple2<pbrt::Point2,_int>::operator[](&local_8,1);
      pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
                (in_stack_fffffffffffffee0,CONCAT44(in_stack_fffffffffffffedc,uVar4));
    }
  }
  return;
}

Assistant:

Image::Image(PixelFormat format, Point2i resolution,
             pstd::span<const std::string> channels, ColorEncodingHandle encoding,
             Allocator alloc)
    : format(format),
      resolution(resolution),
      channelNames(channels.begin(), channels.end()),
      encoding(encoding),
      p8(alloc),
      p16(alloc),
      p32(alloc) {
    if (Is8Bit(format)) {
        p8.resize(NChannels() * resolution[0] * resolution[1]);
        CHECK(encoding != nullptr);
    } else if (Is16Bit(format))
        p16.resize(NChannels() * resolution[0] * resolution[1]);
    else if (Is32Bit(format))
        p32.resize(NChannels() * resolution[0] * resolution[1]);
    else
        LOG_FATAL("Unhandled format in Image::Image()");
}